

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

int tdefl_flush_block(tdefl_compressor *d,int flush)

{
  mz_uint mVar1;
  mz_uint8 *pmVar2;
  bool bVar3;
  uint uVar4;
  mz_uint mVar5;
  mz_bool mVar6;
  mz_uint local_e8;
  bool local_d1;
  mz_uint8 *local_d0;
  int bytes_to_copy;
  mz_uint len_11;
  mz_uint bits_11;
  mz_uint len_10;
  mz_uint bits_10;
  mz_uint len_9;
  mz_uint bits_9;
  mz_uint z;
  mz_uint i_2;
  mz_uint len_8;
  mz_uint bits_8;
  mz_uint a;
  mz_uint i_1;
  mz_uint len_7;
  mz_uint bits_7;
  mz_uint len_6;
  mz_uint bits_6;
  mz_uint len_5;
  mz_uint bits_5;
  mz_uint len_4;
  mz_uint bits_4;
  mz_uint len_3;
  mz_uint bits_3;
  mz_uint i;
  mz_uint len_2;
  mz_uint bits_2;
  mz_uint len_1;
  mz_uint bits_1;
  mz_uint len;
  mz_uint bits;
  mz_uint8 *pOutput_buf_start;
  int use_raw_block;
  int n;
  mz_bool comp_block_succeeded;
  mz_uint8 *pSaved_output_buf;
  mz_uint saved_bits_in;
  mz_uint saved_bit_buf;
  int flush_local;
  tdefl_compressor *d_local;
  
  use_raw_block = 0;
  bVar3 = false;
  if ((d->m_flags & 0x80000) != 0) {
    bVar3 = d->m_lookahead_pos - d->m_lz_code_buf_dict_pos <= d->m_dict_size;
  }
  if ((d->m_pPut_buf_func == (tdefl_put_buf_func_ptr)0x0) &&
     (0x14ccb < *d->m_pOut_buf_size - d->m_out_buf_ofs)) {
    local_d0 = (mz_uint8 *)((long)d->m_pOut_buf + d->m_out_buf_ofs);
  }
  else {
    local_d0 = d->m_output_buf;
  }
  d->m_pOutput_buf = local_d0;
  d->m_pOutput_buf_end = d->m_pOutput_buf + 0x14cbc;
  if (d->m_output_flush_remaining != 0) {
    __assert_fail("!d->m_output_flush_remaining",
                  "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                  ,0x4e6,"int tdefl_flush_block(tdefl_compressor *, int)");
  }
  d->m_output_flush_ofs = 0;
  d->m_output_flush_remaining = 0;
  *d->m_pLZ_flags = (mz_uint8)((int)(uint)*d->m_pLZ_flags >> ((byte)d->m_num_flags_left & 0x1f));
  d->m_pLZ_code_buf = d->m_pLZ_code_buf + -(long)(int)(uint)(d->m_num_flags_left == 8);
  if (((d->m_flags & 0x1000) != 0) && (d->m_block_index == 0)) {
    d->m_bit_buffer = 0x78 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
    d->m_bits_in = d->m_bits_in + 8;
    while (7 < d->m_bits_in) {
      if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
        pmVar2 = d->m_pOutput_buf;
        d->m_pOutput_buf = pmVar2 + 1;
        *pmVar2 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      d->m_bits_in = d->m_bits_in - 8;
    }
    d->m_bit_buffer = 1 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
    d->m_bits_in = d->m_bits_in + 8;
    while (7 < d->m_bits_in) {
      if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
        pmVar2 = d->m_pOutput_buf;
        d->m_pOutput_buf = pmVar2 + 1;
        *pmVar2 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      d->m_bits_in = d->m_bits_in - 8;
    }
  }
  if ((flush == 4) < 2) {
    d->m_bit_buffer = (uint)(flush == 4) << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
    d->m_bits_in = d->m_bits_in + 1;
    while (7 < d->m_bits_in) {
      if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
        pmVar2 = d->m_pOutput_buf;
        d->m_pOutput_buf = pmVar2 + 1;
        *pmVar2 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      d->m_bits_in = d->m_bits_in - 8;
    }
    pmVar2 = d->m_pOutput_buf;
    mVar5 = d->m_bit_buffer;
    mVar1 = d->m_bits_in;
    if (!bVar3) {
      local_d1 = true;
      if ((d->m_flags & 0x40000) == 0) {
        local_d1 = d->m_total_lz_bytes < 0x30;
      }
      use_raw_block = tdefl_compress_block(d,(uint)local_d1);
    }
    if (((bVar3) ||
        ((d->m_total_lz_bytes != 0 &&
         ((long)(ulong)d->m_total_lz_bytes <= (long)(d->m_pOutput_buf + (1 - (long)pmVar2)))))) &&
       (d->m_lookahead_pos - d->m_lz_code_buf_dict_pos <= d->m_dict_size)) {
      d->m_pOutput_buf = pmVar2;
      d->m_bit_buffer = mVar5;
      d->m_bits_in = mVar1;
      d->m_bit_buffer = 0 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
      d->m_bits_in = d->m_bits_in + 2;
      while (7 < d->m_bits_in) {
        if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
          pmVar2 = d->m_pOutput_buf;
          d->m_pOutput_buf = pmVar2 + 1;
          *pmVar2 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        d->m_bits_in = d->m_bits_in - 8;
      }
      if (d->m_bits_in != 0) {
        d->m_bit_buffer = 0 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
        d->m_bits_in = (8 - d->m_bits_in) + d->m_bits_in;
        while (7 < d->m_bits_in) {
          if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
            pmVar2 = d->m_pOutput_buf;
            d->m_pOutput_buf = pmVar2 + 1;
            *pmVar2 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          d->m_bits_in = d->m_bits_in - 8;
        }
      }
      len_3 = 2;
      while (len_3 != 0) {
        uVar4 = d->m_total_lz_bytes & 0xffff;
        if (0xffff < uVar4) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                        ,0x50a,"int tdefl_flush_block(tdefl_compressor *, int)");
        }
        d->m_bit_buffer = uVar4 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
        d->m_bits_in = d->m_bits_in + 0x10;
        while (7 < d->m_bits_in) {
          if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
            pmVar2 = d->m_pOutput_buf;
            d->m_pOutput_buf = pmVar2 + 1;
            *pmVar2 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          d->m_bits_in = d->m_bits_in - 8;
        }
        len_3 = len_3 - 1;
        d->m_total_lz_bytes = d->m_total_lz_bytes ^ 0xffff;
      }
      for (len_3 = 0; len_3 < d->m_total_lz_bytes; len_3 = len_3 + 1) {
        if (0xff < d->m_dict[d->m_lz_code_buf_dict_pos + len_3 & 0x7fff]) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                        ,0x50e,"int tdefl_flush_block(tdefl_compressor *, int)");
        }
        d->m_bit_buffer =
             (uint)d->m_dict[d->m_lz_code_buf_dict_pos + len_3 & 0x7fff] <<
             ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
        d->m_bits_in = d->m_bits_in + 8;
        while (7 < d->m_bits_in) {
          if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
            pmVar2 = d->m_pOutput_buf;
            d->m_pOutput_buf = pmVar2 + 1;
            *pmVar2 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          d->m_bits_in = d->m_bits_in - 8;
        }
      }
    }
    else if (use_raw_block == 0) {
      d->m_pOutput_buf = pmVar2;
      d->m_bit_buffer = mVar5;
      d->m_bits_in = mVar1;
      tdefl_compress_block(d,1);
    }
    if (flush != 0) {
      if (flush == 4) {
        if (d->m_bits_in != 0) {
          d->m_bit_buffer = 0 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
          d->m_bits_in = (8 - d->m_bits_in) + d->m_bits_in;
          while (7 < d->m_bits_in) {
            if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
              pmVar2 = d->m_pOutput_buf;
              d->m_pOutput_buf = pmVar2 + 1;
              *pmVar2 = (mz_uint8)d->m_bit_buffer;
            }
            d->m_bit_buffer = d->m_bit_buffer >> 8;
            d->m_bits_in = d->m_bits_in - 8;
          }
        }
        if ((d->m_flags & 0x1000) != 0) {
          len_8 = d->m_adler32;
          for (bits_8 = 0; bits_8 < 4; bits_8 = bits_8 + 1) {
            if (0xff < len_8 >> 0x18) {
              __assert_fail("bits <= ((1U << len) - 1U)",
                            "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                            ,0x526,"int tdefl_flush_block(tdefl_compressor *, int)");
            }
            d->m_bit_buffer = (len_8 >> 0x18) << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
            d->m_bits_in = d->m_bits_in + 8;
            while (7 < d->m_bits_in) {
              if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
                pmVar2 = d->m_pOutput_buf;
                d->m_pOutput_buf = pmVar2 + 1;
                *pmVar2 = (mz_uint8)d->m_bit_buffer;
              }
              d->m_bit_buffer = d->m_bit_buffer >> 8;
              d->m_bits_in = d->m_bits_in - 8;
            }
            len_8 = len_8 << 8;
          }
        }
      }
      else {
        len_9 = 0;
        d->m_bit_buffer = 0 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
        d->m_bits_in = d->m_bits_in + 3;
        while (7 < d->m_bits_in) {
          if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
            pmVar2 = d->m_pOutput_buf;
            d->m_pOutput_buf = pmVar2 + 1;
            *pmVar2 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          d->m_bits_in = d->m_bits_in - 8;
        }
        if (d->m_bits_in != 0) {
          d->m_bit_buffer = 0 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
          d->m_bits_in = (8 - d->m_bits_in) + d->m_bits_in;
          while (7 < d->m_bits_in) {
            if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
              pmVar2 = d->m_pOutput_buf;
              d->m_pOutput_buf = pmVar2 + 1;
              *pmVar2 = (mz_uint8)d->m_bit_buffer;
            }
            d->m_bit_buffer = d->m_bit_buffer >> 8;
            d->m_bits_in = d->m_bits_in - 8;
          }
        }
        for (bits_9 = 2; bits_9 != 0; bits_9 = bits_9 - 1) {
          if (0xffff < len_9) {
            __assert_fail("bits <= ((1U << len) - 1U)",
                          "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                          ,0x535,"int tdefl_flush_block(tdefl_compressor *, int)");
          }
          d->m_bit_buffer = len_9 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
          d->m_bits_in = d->m_bits_in + 0x10;
          while (7 < d->m_bits_in) {
            if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
              pmVar2 = d->m_pOutput_buf;
              d->m_pOutput_buf = pmVar2 + 1;
              *pmVar2 = (mz_uint8)d->m_bit_buffer;
            }
            d->m_bit_buffer = d->m_bit_buffer >> 8;
            d->m_bits_in = d->m_bits_in - 8;
          }
          len_9 = len_9 ^ 0xffff;
        }
      }
    }
    if (d->m_pOutput_buf < d->m_pOutput_buf_end) {
      memset(d->m_huff_count,0,0x240);
      memset(d->m_huff_count + 1,0,0x40);
      d->m_pLZ_code_buf = d->m_lz_code_buf + 1;
      d->m_pLZ_flags = d->m_lz_code_buf;
      d->m_num_flags_left = 8;
      d->m_lz_code_buf_dict_pos = d->m_total_lz_bytes + d->m_lz_code_buf_dict_pos;
      d->m_total_lz_bytes = 0;
      d->m_block_index = d->m_block_index + 1;
      mVar5 = (int)d->m_pOutput_buf - (int)local_d0;
      if (mVar5 != 0) {
        if (d->m_pPut_buf_func == (tdefl_put_buf_func_ptr)0x0) {
          if (local_d0 == d->m_output_buf) {
            local_e8 = mVar5;
            if (*d->m_pOut_buf_size - d->m_out_buf_ofs <= (ulong)(long)(int)mVar5) {
              local_e8 = (int)*d->m_pOut_buf_size - (int)d->m_out_buf_ofs;
            }
            memcpy((void *)((long)d->m_pOut_buf + d->m_out_buf_ofs),d->m_output_buf,
                   (long)(int)local_e8);
            d->m_out_buf_ofs = (long)(int)local_e8 + d->m_out_buf_ofs;
            if (mVar5 - local_e8 != 0) {
              d->m_output_flush_ofs = local_e8;
              d->m_output_flush_remaining = mVar5 - local_e8;
            }
          }
          else {
            d->m_out_buf_ofs = (long)(int)mVar5 + d->m_out_buf_ofs;
          }
        }
        else {
          *d->m_pIn_buf_size = (long)d->m_pSrc - (long)d->m_pIn_buf;
          mVar6 = (*d->m_pPut_buf_func)(d->m_output_buf,mVar5,d->m_pPut_buf_user);
          if (mVar6 == 0) {
            d->m_prev_return_status = TDEFL_STATUS_PUT_BUF_FAILED;
            return -1;
          }
        }
      }
      return d->m_output_flush_remaining;
    }
    __assert_fail("d->m_pOutput_buf < d->m_pOutput_buf_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                  ,0x53a,"int tdefl_flush_block(tdefl_compressor *, int)");
  }
  __assert_fail("bits <= ((1U << len) - 1U)",
                "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/miniz/miniz.cpp"
                ,0x4f3,"int tdefl_flush_block(tdefl_compressor *, int)");
}

Assistant:

static int tdefl_flush_block(tdefl_compressor *d, int flush)
{
    mz_uint saved_bit_buf, saved_bits_in;
    mz_uint8 *pSaved_output_buf;
    mz_bool comp_block_succeeded = MZ_FALSE;
    int n, use_raw_block = ((d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS) != 0) && (d->m_lookahead_pos - d->m_lz_code_buf_dict_pos) <= d->m_dict_size;
    mz_uint8 *pOutput_buf_start = ((d->m_pPut_buf_func == NULL) && ((*d->m_pOut_buf_size - d->m_out_buf_ofs) >= TDEFL_OUT_BUF_SIZE)) ? ((mz_uint8 *)d->m_pOut_buf + d->m_out_buf_ofs) : d->m_output_buf;

    d->m_pOutput_buf = pOutput_buf_start;
    d->m_pOutput_buf_end = d->m_pOutput_buf + TDEFL_OUT_BUF_SIZE - 16;

    MZ_ASSERT(!d->m_output_flush_remaining);
    d->m_output_flush_ofs = 0;
    d->m_output_flush_remaining = 0;

    *d->m_pLZ_flags = (mz_uint8)(*d->m_pLZ_flags >> d->m_num_flags_left);
    d->m_pLZ_code_buf -= (d->m_num_flags_left == 8);

    if ((d->m_flags & TDEFL_WRITE_ZLIB_HEADER) && (!d->m_block_index))
    {
        TDEFL_PUT_BITS(0x78, 8);
        TDEFL_PUT_BITS(0x01, 8);
    }

    TDEFL_PUT_BITS(flush == TDEFL_FINISH, 1);

    pSaved_output_buf = d->m_pOutput_buf;
    saved_bit_buf = d->m_bit_buffer;
    saved_bits_in = d->m_bits_in;

    if (!use_raw_block)
        comp_block_succeeded = tdefl_compress_block(d, (d->m_flags & TDEFL_FORCE_ALL_STATIC_BLOCKS) || (d->m_total_lz_bytes < 48));

    /* If the block gets expanded, forget the current contents of the output buffer and send a raw block instead. */
    if (((use_raw_block) || ((d->m_total_lz_bytes) && ((d->m_pOutput_buf - pSaved_output_buf + 1U) >= d->m_total_lz_bytes))) &&
        ((d->m_lookahead_pos - d->m_lz_code_buf_dict_pos) <= d->m_dict_size))
    {
        mz_uint i;
        d->m_pOutput_buf = pSaved_output_buf;
        d->m_bit_buffer = saved_bit_buf, d->m_bits_in = saved_bits_in;
        TDEFL_PUT_BITS(0, 2);
        if (d->m_bits_in)
        {
            TDEFL_PUT_BITS(0, 8 - d->m_bits_in);
        }
        for (i = 2; i; --i, d->m_total_lz_bytes ^= 0xFFFF)
        {
            TDEFL_PUT_BITS(d->m_total_lz_bytes & 0xFFFF, 16);
        }
        for (i = 0; i < d->m_total_lz_bytes; ++i)
        {
            TDEFL_PUT_BITS(d->m_dict[(d->m_lz_code_buf_dict_pos + i) & TDEFL_LZ_DICT_SIZE_MASK], 8);
        }
    }
    /* Check for the extremely unlikely (if not impossible) case of the compressed block not fitting into the output buffer when using dynamic codes. */
    else if (!comp_block_succeeded)
    {
        d->m_pOutput_buf = pSaved_output_buf;
        d->m_bit_buffer = saved_bit_buf, d->m_bits_in = saved_bits_in;
        tdefl_compress_block(d, MZ_TRUE);
    }

    if (flush)
    {
        if (flush == TDEFL_FINISH)
        {
            if (d->m_bits_in)
            {
                TDEFL_PUT_BITS(0, 8 - d->m_bits_in);
            }
            if (d->m_flags & TDEFL_WRITE_ZLIB_HEADER)
            {
                mz_uint i, a = d->m_adler32;
                for (i = 0; i < 4; i++)
                {
                    TDEFL_PUT_BITS((a >> 24) & 0xFF, 8);
                    a <<= 8;
                }
            }
        }
        else
        {
            mz_uint i, z = 0;
            TDEFL_PUT_BITS(0, 3);
            if (d->m_bits_in)
            {
                TDEFL_PUT_BITS(0, 8 - d->m_bits_in);
            }
            for (i = 2; i; --i, z ^= 0xFFFF)
            {
                TDEFL_PUT_BITS(z & 0xFFFF, 16);
            }
        }
    }

    MZ_ASSERT(d->m_pOutput_buf < d->m_pOutput_buf_end);

    memset(&d->m_huff_count[0][0], 0, sizeof(d->m_huff_count[0][0]) * TDEFL_MAX_HUFF_SYMBOLS_0);
    memset(&d->m_huff_count[1][0], 0, sizeof(d->m_huff_count[1][0]) * TDEFL_MAX_HUFF_SYMBOLS_1);

    d->m_pLZ_code_buf = d->m_lz_code_buf + 1;
    d->m_pLZ_flags = d->m_lz_code_buf;
    d->m_num_flags_left = 8;
    d->m_lz_code_buf_dict_pos += d->m_total_lz_bytes;
    d->m_total_lz_bytes = 0;
    d->m_block_index++;

    if ((n = (int)(d->m_pOutput_buf - pOutput_buf_start)) != 0)
    {
        if (d->m_pPut_buf_func)
        {
            *d->m_pIn_buf_size = d->m_pSrc - (const mz_uint8 *)d->m_pIn_buf;
            if (!(*d->m_pPut_buf_func)(d->m_output_buf, n, d->m_pPut_buf_user))
                return (d->m_prev_return_status = TDEFL_STATUS_PUT_BUF_FAILED);
        }
        else if (pOutput_buf_start == d->m_output_buf)
        {
            int bytes_to_copy = (int)MZ_MIN((size_t)n, (size_t)(*d->m_pOut_buf_size - d->m_out_buf_ofs));
            memcpy((mz_uint8 *)d->m_pOut_buf + d->m_out_buf_ofs, d->m_output_buf, bytes_to_copy);
            d->m_out_buf_ofs += bytes_to_copy;
            if ((n -= bytes_to_copy) != 0)
            {
                d->m_output_flush_ofs = bytes_to_copy;
                d->m_output_flush_remaining = n;
            }
        }
        else
        {
            d->m_out_buf_ofs += n;
        }
    }

    return d->m_output_flush_remaining;
}